

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ProgramBinaryUniformResetCase::setUniformsRandom
          (ProgramBinaryUniformResetCase *this,ShaderProgram *program)

{
  GLint location;
  GLint location_00;
  GLint location_01;
  int v0;
  MessageBuilder *this_00;
  float v0_00;
  float floatVal;
  deInt32 intVal;
  GLint floatLoc;
  GLint intLoc;
  GLint boolLoc;
  MessageBuilder local_1a8;
  deUint32 local_24;
  TestLog *pTStack_20;
  deUint32 glProg;
  TestLog *log;
  ShaderProgram *program_local;
  ProgramBinaryUniformResetCase *this_local;
  
  log = (TestLog *)program;
  program_local = (ShaderProgram *)this;
  pTStack_20 = tcu::TestContext::getLog
                         ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
  local_24 = glu::ShaderProgram::getProgram((ShaderProgram *)log);
  tcu::TestLog::operator<<(&local_1a8,pTStack_20,(BeginMessageToken *)&tcu::TestLog::Message);
  this_00 = tcu::MessageBuilder::operator<<
                      (&local_1a8,(char (*) [44])"Setting uniforms to random non-zero values.");
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  glu::CallLogWrapper::glUseProgram(&(this->super_ProgramBinaryCase).super_CallLogWrapper,local_24);
  location = glu::CallLogWrapper::glGetUniformLocation
                       (&(this->super_ProgramBinaryCase).super_CallLogWrapper,local_24,"u_boolVar");
  location_00 = glu::CallLogWrapper::glGetUniformLocation
                          (&(this->super_ProgramBinaryCase).super_CallLogWrapper,local_24,"u_intVar"
                          );
  location_01 = glu::CallLogWrapper::glGetUniformLocation
                          (&(this->super_ProgramBinaryCase).super_CallLogWrapper,local_24,
                           "u_floatVar");
  v0 = de::Random::getInt(&this->m_rnd,1,1000);
  v0_00 = de::Random::getFloat(&this->m_rnd,1.0,1000.0);
  glu::CallLogWrapper::glUniform1i(&(this->super_ProgramBinaryCase).super_CallLogWrapper,location,1)
  ;
  glu::CallLogWrapper::glUniform1f
            (&(this->super_ProgramBinaryCase).super_CallLogWrapper,location_01,v0_00);
  glu::CallLogWrapper::glUniform1i
            (&(this->super_ProgramBinaryCase).super_CallLogWrapper,location_00,v0);
  return;
}

Assistant:

void setUniformsRandom (glu::ShaderProgram& program)
	{
		TestLog&		log		= m_testCtx.getLog();
		const deUint32	glProg	= program.getProgram();

		log << TestLog::Message << "Setting uniforms to random non-zero values." << TestLog::EndMessage;

		glUseProgram(glProg);

		{
			const GLint		boolLoc		= glGetUniformLocation(glProg, "u_boolVar");
			const GLint		intLoc		= glGetUniformLocation(glProg, "u_intVar");
			const GLint		floatLoc	= glGetUniformLocation(glProg, "u_floatVar");

			const deInt32	intVal		= m_rnd.getInt(1, 1000);
			const float		floatVal	= m_rnd.getFloat(1.0, 1000.0);

			glUniform1i(boolLoc,	GL_TRUE);
			glUniform1f(floatLoc,	floatVal);
			glUniform1i(intLoc,		intVal);
		}
	}